

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O0

Span<const_unsigned_char> __thiscall
bssl::SSLAEADContext::GetAdditionalData
          (SSLAEADContext *this,uint8_t *storage,uint8_t type,uint16_t record_version,
          uint64_t seqnum,size_t plaintext_len,Span<const_unsigned_char> header)

{
  Span<const_unsigned_char> SVar1;
  Span<unsigned_char> local_58;
  size_t local_48;
  size_t len;
  size_t plaintext_len_local;
  uint64_t seqnum_local;
  uint16_t record_version_local;
  uint8_t *puStack_28;
  uint8_t type_local;
  uint8_t *storage_local;
  SSLAEADContext *this_local;
  size_t local_10;
  
  if (((byte)this->field_0x26a >> 4 & 1) == 0) {
    len = plaintext_len;
    plaintext_len_local = seqnum;
    seqnum_local._4_2_ = record_version;
    seqnum_local._7_1_ = type;
    puStack_28 = storage;
    storage_local = (uint8_t *)this;
    CRYPTO_store_u64_be(storage,seqnum);
    puStack_28[8] = seqnum_local._7_1_;
    puStack_28[9] = (uchar)(seqnum_local._4_2_ >> 8);
    local_48 = 0xb;
    puStack_28[10] = (uchar)seqnum_local._4_2_;
    if (((byte)this->field_0x26a >> 3 & 1) == 0) {
      puStack_28[0xb] = (uchar)(len >> 8);
      local_48 = 0xd;
      puStack_28[0xc] = (uchar)len;
    }
    Span<unsigned_char>::Span(&local_58,puStack_28,local_48);
    Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
              ((Span<unsigned_char_const> *)&this_local,&local_58);
  }
  else {
    this_local = (SSLAEADContext *)header.data_;
    local_10 = header.size_;
  }
  SVar1.size_ = local_10;
  SVar1.data_ = (uchar *)this_local;
  return SVar1;
}

Assistant:

Span<const uint8_t> SSLAEADContext::GetAdditionalData(
    uint8_t storage[13], uint8_t type, uint16_t record_version, uint64_t seqnum,
    size_t plaintext_len, Span<const uint8_t> header) {
  if (ad_is_header_) {
    return header;
  }

  CRYPTO_store_u64_be(storage, seqnum);
  size_t len = 8;
  storage[len++] = type;
  storage[len++] = static_cast<uint8_t>((record_version >> 8));
  storage[len++] = static_cast<uint8_t>(record_version);
  if (!omit_length_in_ad_) {
    storage[len++] = static_cast<uint8_t>((plaintext_len >> 8));
    storage[len++] = static_cast<uint8_t>(plaintext_len);
  }
  return Span(storage, len);
}